

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

int crec_isnonzero(CType *s,void *p)

{
  void *p_local;
  CType *s_local;
  uint local_4;
  
  if (p == (void *)0x0) {
    local_4 = 0;
  }
  else if (p == (void *)0x1) {
    local_4 = 1;
  }
  else if ((s->info & 0x4000000) == 0) {
    if (s->size == 1) {
      local_4 = (uint)(*p != '\0');
    }
    else if (s->size == 2) {
      local_4 = (uint)(*p != 0);
    }
    else if (s->size == 4) {
      local_4 = (uint)(*p != 0);
    }
    else {
      local_4 = (uint)(*p != 0);
    }
  }
  else if (s->size == 4) {
    local_4 = (uint)(*p != 0.0);
  }
  else {
    local_4 = (uint)(*p != 0.0);
  }
  return local_4;
}

Assistant:

static int crec_isnonzero(CType *s, void *p)
{
  if (p == (void *)0)
    return 0;
  if (p == (void *)1)
    return 1;
  if ((s->info & CTF_FP)) {
    if (s->size == sizeof(float))
      return (*(float *)p != 0);
    else
      return (*(double *)p != 0);
  } else {
    if (s->size == 1)
      return (*(uint8_t *)p != 0);
    else if (s->size == 2)
      return (*(uint16_t *)p != 0);
    else if (s->size == 4)
      return (*(uint32_t *)p != 0);
    else
      return (*(uint64_t *)p != 0);
  }
}